

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::remap_graphics_pipeline_ci
          (Impl *this,VkGraphicsPipelineCreateInfo *info)

{
  bool bVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  
  bVar1 = remap_render_pass_handle(this,info->renderPass,&info->renderPass);
  if ((bVar1) && (bVar1 = remap_pipeline_layout_handle(this,info->layout,&info->layout), bVar1)) {
    for (piVar2 = (int *)info->pNext; piVar2 != (int *)0x0; piVar2 = *(int **)(piVar2 + 2)) {
      if (*piVar2 == 0x3b9f36d0) goto LAB_0012f15b;
    }
    piVar2 = (int *)0x0;
LAB_0012f15b:
    if ((piVar2 != (int *)0x0) && (piVar2[4] != 0)) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        bVar1 = remap_graphics_pipeline_handle
                          (this,*(VkPipeline *)(*(long *)(piVar2 + 6) + lVar3),
                           (VkPipeline *)(*(long *)(piVar2 + 6) + lVar3));
        if (!bVar1) {
          return false;
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 8;
      } while (uVar4 < (uint)piVar2[4]);
    }
    if ((info->basePipelineHandle == (VkPipeline)0x0) ||
       (bVar1 = remap_graphics_pipeline_handle
                          (this,info->basePipelineHandle,&info->basePipelineHandle), bVar1)) {
      bVar1 = remap_shader_module_handles<VkGraphicsPipelineCreateInfo>(this,info);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::remap_graphics_pipeline_ci(VkGraphicsPipelineCreateInfo *info)
{
	if (!remap_render_pass_handle(info->renderPass, &info->renderPass))
		return false;
	if (!remap_pipeline_layout_handle(info->layout, &info->layout))
		return false;

	auto *library = find_pnext<VkPipelineLibraryCreateInfoKHR>(
			VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR, info->pNext);

	if (library)
	{
		for (uint32_t i = 0; i < library->libraryCount; i++)
			if (!remap_graphics_pipeline_handle(library->pLibraries[i], const_cast<VkPipeline *>(&library->pLibraries[i])))
				return false;
	}

	if (info->basePipelineHandle != VK_NULL_HANDLE)
		if (!remap_graphics_pipeline_handle(info->basePipelineHandle, &info->basePipelineHandle))
			return false;

	if (!remap_shader_module_handles(info))
		return false;

	return true;
}